

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

stringstream * __thiscall
Assimp::JSONWriter::LiteralToString(JSONWriter *this,stringstream *stream,float f)

{
  char *pcVar1;
  allocator<char> local_55;
  float local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (ABS(f) == INFINITY) {
    if ((this->flags & 2) != 0) {
      local_54 = f;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Infinity\"",&local_55)
      ;
      pcVar1 = "\"";
      if (local_54 < 0.0) {
        pcVar1 = "\"-";
      }
      std::operator+(&local_50,pcVar1,&local_30);
      std::operator<<((ostream *)(stream + 0x10),(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      return stream;
    }
    pcVar1 = "0.0";
  }
  else {
    if (!NAN(f)) {
      std::ostream::operator<<(stream + 0x10,f);
      return stream;
    }
    if ((this->flags & 2) == 0) {
      pcVar1 = "0.0";
    }
    else {
      pcVar1 = "\"NaN\"";
    }
  }
  std::operator<<((ostream *)(stream + 0x10),pcVar1);
  return stream;
}

Assistant:

std::stringstream& LiteralToString(std::stringstream& stream, float f) {
        if (!std::numeric_limits<float>::is_iec559) {
            // on a non IEEE-754 platform, we make no assumptions about the representation or existence
            // of special floating-point numbers. 
            stream << f;
            return stream;
        }

        // JSON does not support writing Inf/Nan
        // [RFC 4672: "Numeric values that cannot be represented as sequences of digits
        // (such as Infinity and NaN) are not permitted."]
        // Nevertheless, many parsers will accept the special keywords Infinity, -Infinity and NaN
        if (std::numeric_limits<float>::infinity() == fabs(f)) {
            if (flags & Flag_WriteSpecialFloats) {
                stream << (f < 0 ? "\"-" : "\"") + std::string("Infinity\"");
                return stream;
            }
            //  we should print this warning, but we can't - this is called from within a generic assimp exporter, we cannot use cerr
            //	std::cerr << "warning: cannot represent infinite number literal, substituting 0 instead (use -i flag to enforce Infinity/NaN)" << std::endl;
            stream << "0.0";
            return stream;
        }
        // f!=f is the most reliable test for NaNs that I know of
        else if (f != f) {
            if (flags & Flag_WriteSpecialFloats) {
                stream << "\"NaN\"";
                return stream;
            }
            //  we should print this warning, but we can't - this is called from within a generic assimp exporter, we cannot use cerr
            //	std::cerr << "warning: cannot represent infinite number literal, substituting 0 instead (use -i flag to enforce Infinity/NaN)" << std::endl;
            stream << "0.0";
            return stream;
        }

        stream << f;
        return stream;
    }